

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O0

void __thiscall VW::config::options_boost_po::check_unregistered(options_boost_po *this)

{
  bool bVar1;
  reference pbVar2;
  size_type sVar3;
  ostream *poVar4;
  undefined8 uVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  stringstream __msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *supplied;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdf8;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe00;
  key_type *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe48;
  stringstream local_1b0 [4];
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  vw_unrecognised_option_exception *in_stack_fffffffffffffe60;
  _Self local_20;
  _Self local_18;
  size_t *local_10;
  
  local_10 = &in_RDI[9]._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffdf8);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(in_stack_fffffffffffffdf8);
  do {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) {
      return;
    }
    pbVar2 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x326f5f);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(in_RDI,in_stack_fffffffffffffe08);
    if (sVar3 == 0) {
      sVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(in_RDI,in_stack_fffffffffffffe08);
      if (sVar3 == 0) {
        std::__cxx11::stringstream::stringstream(local_1b0);
        poVar4 = std::operator<<((ostream *)&stack0xfffffffffffffe60,"unrecognised option \'--");
        poVar4 = std::operator<<(poVar4,(string *)pbVar2);
        std::operator<<(poVar4,"\'");
        uVar5 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        vw_unrecognised_option_exception::vw_unrecognised_option_exception
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe48);
        __cxa_throw(uVar5,&vw_unrecognised_option_exception::typeinfo,
                    vw_unrecognised_option_exception::~vw_unrecognised_option_exception);
      }
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(in_stack_fffffffffffffe00);
  } while( true );
}

Assistant:

void options_boost_po::check_unregistered()
{
  for (auto const& supplied : m_supplied_options)
  {
    if (m_defined_options.count(supplied) == 0 && m_ignore_supplied.count(supplied) == 0)
    {
      THROW_EX(VW::vw_unrecognised_option_exception, "unrecognised option '--" << supplied << "'");
    }
  }
}